

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

void tinyobj::LoadMtl(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *material_map,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     istream *inStream,string *warning,string *err)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  char *pcVar4;
  size_t sVar5;
  size_type sVar6;
  ostream *poVar7;
  ulong uVar8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  this;
  long in_RCX;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *in_RSI;
  value_type *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_int>_>::value,_pair<iterator,_bool>_>
  _Var9;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_string<char>_>_>::value,_pair<iterator,_bool>_>
  _Var10;
  string value;
  string key;
  ptrdiff_t len;
  char *_space;
  real_t b_4;
  real_t g_4;
  real_t r_4;
  real_t b_3;
  real_t g_3;
  real_t r_3;
  real_t b_2;
  real_t g_2;
  real_t r_2;
  real_t b_1;
  real_t g_1;
  real_t r_1;
  real_t b;
  real_t g;
  real_t r;
  stringstream sstr;
  char *token;
  string linebuf;
  size_t line_no;
  stringstream warn_ss;
  bool has_kd;
  bool has_tr;
  bool has_d;
  material_t material;
  undefined7 in_stack_fffffffffffff238;
  undefined1 in_stack_fffffffffffff23f;
  material_t *in_stack_fffffffffffff240;
  value_type *in_stack_fffffffffffff248;
  undefined7 in_stack_fffffffffffff250;
  undefined1 in_stack_fffffffffffff257;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffff258;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff288;
  real_t in_stack_fffffffffffff290;
  real_t in_stack_fffffffffffff294;
  ostream *in_stack_fffffffffffff2f8;
  undefined4 in_stack_fffffffffffff300;
  real_t in_stack_fffffffffffff304;
  int in_stack_fffffffffffff308;
  real_t in_stack_fffffffffffff30c;
  string local_c90 [32];
  _Base_ptr local_c70;
  undefined1 local_c68;
  undefined4 local_c5c;
  _Base_ptr local_c30;
  undefined1 local_c28;
  allocator local_bd9;
  string local_bd8 [39];
  undefined1 local_bb1 [33];
  ulong local_b90;
  char *local_b88;
  undefined4 local_b58;
  undefined4 local_b54;
  undefined4 local_b50;
  string local_b40 [32];
  stringstream local_b20 [16];
  ostream local_b10 [376];
  _Base_ptr local_998;
  undefined1 local_990;
  undefined4 local_984;
  char *local_958;
  string local_950 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  ulong local_910;
  stringstream local_908 [16];
  ostream local_8f8 [377];
  byte local_77f;
  byte local_77e;
  byte local_77d;
  string local_770 [44];
  undefined4 local_744;
  undefined4 local_740;
  undefined4 local_73c;
  real_t local_714;
  real_t local_710;
  real_t local_70c;
  int local_708;
  string local_640 [832];
  real_t local_300;
  real_t local_2fc;
  real_t local_2f8;
  real_t local_2f4;
  real_t local_2f0;
  real_t local_2ec;
  real_t local_2e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *local_10;
  value_type *local_8;
  
  local_58.second.field_2._8_8_ = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  material_t::material_t(in_stack_fffffffffffff240);
  InitMaterial(in_stack_fffffffffffff240);
  local_77d = 0;
  local_77e = 0;
  local_77f = 0;
  std::__cxx11::stringstream::stringstream(local_908);
  local_910 = 0;
  std::__cxx11::string::string((string *)&local_930);
  while (iVar2 = std::istream::peek(), iVar2 != -1) {
    safeGetline((istream *)in_stack_fffffffffffff258._M_node,
                (string *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250));
    local_910 = local_910 + 1;
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&local_930);
    if (sVar3 != 0) {
      std::__cxx11::string::find_last_not_of((char *)&local_930,0x42b450);
      std::__cxx11::string::substr((ulong)local_950,(ulong)&local_930);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
                 in_stack_fffffffffffff288);
      std::__cxx11::string::~string(local_950);
    }
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&local_930);
    if (sVar3 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (&local_930);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_930);
      if (*pcVar4 == '\n') {
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(&local_930);
        std::__cxx11::string::erase((ulong)&local_930,sVar3 - 1);
      }
    }
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&local_930);
    if (sVar3 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (&local_930);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&local_930);
      if (*pcVar4 == '\r') {
        sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(&local_930);
        std::__cxx11::string::erase((ulong)&local_930,sVar3 - 1);
      }
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a7ca6
                      );
    if (!bVar1) {
      local_958 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  c_str(&in_stack_fffffffffffff240->name);
      sVar5 = strspn(local_958," \t");
      local_958 = local_958 + sVar5;
      if ((*local_958 != '\0') && (*local_958 != '#')) {
        iVar2 = strncmp(local_958,"newmtl",6);
        if ((iVar2 == 0) && ((local_958[6] == ' ' || (local_958[6] == '\t')))) {
          bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x1a7d6c);
          if (!bVar1) {
            sVar6 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size
                              (local_10);
            local_984 = (undefined4)sVar6;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                        *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
                       &in_stack_fffffffffffff248->name,(int *)in_stack_fffffffffffff240);
            _Var9 = std::
                    map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                    ::insert<std::pair<std::__cxx11::string,int>>
                              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
                               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                                *)in_stack_fffffffffffff248);
            local_998 = (_Base_ptr)_Var9.first._M_node;
            local_990 = _Var9.second;
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     *)0x1a7e08);
            std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
                      ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
                       CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
                       in_stack_fffffffffffff248);
          }
          InitMaterial(in_stack_fffffffffffff240);
          local_77d = 0;
          local_77e = 0;
          local_958 = local_958 + 7;
          std::__cxx11::stringstream::stringstream(local_b20);
          std::operator<<(local_b10,local_958);
          std::__cxx11::stringstream::str();
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
                     in_stack_fffffffffffff288);
          std::__cxx11::string::~string(local_b40);
          std::__cxx11::stringstream::~stringstream(local_b20);
        }
        else if ((*local_958 == 'K') &&
                ((local_958[1] == 'a' && ((local_958[2] == ' ' || (local_958[2] == '\t')))))) {
          local_958 = local_958 + 2;
          parseReal3((real_t *)in_stack_fffffffffffff260,(real_t *)in_stack_fffffffffffff258._M_node
                     ,(real_t *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
                     (char **)in_stack_fffffffffffff248,(double)in_stack_fffffffffffff240,
                     (double)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     8.57997364961784e-318);
        }
        else if ((*local_958 == 'K') &&
                ((local_958[1] == 'd' && ((local_958[2] == ' ' || (local_958[2] == '\t')))))) {
          local_958 = local_958 + 2;
          parseReal3((real_t *)in_stack_fffffffffffff260,(real_t *)in_stack_fffffffffffff258._M_node
                     ,(real_t *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
                     (char **)in_stack_fffffffffffff248,(double)in_stack_fffffffffffff240,
                     (double)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     8.58099142484827e-318);
          local_744 = local_b50;
          local_740 = local_b54;
          local_73c = local_b58;
          local_77f = 1;
        }
        else if ((*local_958 == 'K') &&
                ((local_958[1] == 's' && ((local_958[2] == ' ' || (local_958[2] == '\t')))))) {
          local_958 = local_958 + 2;
          parseReal3((real_t *)in_stack_fffffffffffff260,(real_t *)in_stack_fffffffffffff258._M_node
                     ,(real_t *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
                     (char **)in_stack_fffffffffffff248,(double)in_stack_fffffffffffff240,
                     (double)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     8.58202896270454e-318);
        }
        else if (((*local_958 == 'K') &&
                 ((local_958[1] == 't' && ((local_958[2] == ' ' || (local_958[2] == '\t')))))) ||
                ((*local_958 == 'T' &&
                 ((local_958[1] == 'f' && ((local_958[2] == ' ' || (local_958[2] == '\t')))))))) {
          local_958 = local_958 + 2;
          parseReal3((real_t *)in_stack_fffffffffffff260,(real_t *)in_stack_fffffffffffff258._M_node
                     ,(real_t *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
                     (char **)in_stack_fffffffffffff248,(double)in_stack_fffffffffffff240,
                     (double)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     8.58335799929185e-318);
        }
        else if (((*local_958 == 'N') && (local_958[1] == 'i')) &&
                ((local_958[2] == ' ' || (local_958[2] == '\t')))) {
          local_958 = local_958 + 2;
          local_710 = parseReal((char **)in_stack_fffffffffffff260,
                                (double)in_stack_fffffffffffff258._M_node);
        }
        else if (((*local_958 == 'K') && (local_958[1] == 'e')) &&
                ((local_958[2] == ' ' || (local_958[2] == '\t')))) {
          local_958 = local_958 + 2;
          parseReal3((real_t *)in_stack_fffffffffffff260,(real_t *)in_stack_fffffffffffff258._M_node
                     ,(real_t *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
                     (char **)in_stack_fffffffffffff248,(double)in_stack_fffffffffffff240,
                     (double)CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                     8.58503288183125e-318);
        }
        else if (((*local_958 == 'N') && (local_958[1] == 's')) &&
                ((local_958[2] == ' ' || (local_958[2] == '\t')))) {
          local_958 = local_958 + 2;
          in_stack_fffffffffffff30c =
               parseReal((char **)in_stack_fffffffffffff260,
                         (double)in_stack_fffffffffffff258._M_node);
          local_714 = in_stack_fffffffffffff30c;
        }
        else {
          iVar2 = strncmp(local_958,"illum",5);
          if ((iVar2 == 0) && ((local_958[5] == ' ' || (local_958[5] == '\t')))) {
            local_958 = local_958 + 6;
            in_stack_fffffffffffff308 = parseInt((char **)in_stack_fffffffffffff240);
            local_708 = in_stack_fffffffffffff308;
          }
          else if ((*local_958 == 'd') && ((local_958[1] == ' ' || (local_958[1] == '\t')))) {
            local_958 = local_958 + 1;
            in_stack_fffffffffffff304 =
                 parseReal((char **)in_stack_fffffffffffff260,
                           (double)in_stack_fffffffffffff258._M_node);
            local_70c = in_stack_fffffffffffff304;
            if ((local_77e & 1) != 0) {
              in_stack_fffffffffffff2f8 =
                   std::operator<<(local_8f8,"Both `d` and `Tr` parameters defined for \"");
              poVar7 = std::operator<<(in_stack_fffffffffffff2f8,local_770);
              poVar7 = std::operator<<(poVar7,"\". Use the value of `d` for dissolve (line ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_910);
              poVar7 = std::operator<<(poVar7," in .mtl.)");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
            local_77d = 1;
          }
          else if ((*local_958 == 'T') &&
                  ((local_958[1] == 'r' && ((local_958[2] == ' ' || (local_958[2] == '\t')))))) {
            local_958 = local_958 + 2;
            if ((local_77d & 1) == 0) {
              local_70c = parseReal((char **)in_stack_fffffffffffff260,
                                    (double)in_stack_fffffffffffff258._M_node);
              local_70c = 1.0 - local_70c;
            }
            else {
              poVar7 = std::operator<<(local_8f8,"Both `d` and `Tr` parameters defined for \"");
              poVar7 = std::operator<<(poVar7,local_770);
              poVar7 = std::operator<<(poVar7,"\". Use the value of `d` for dissolve (line ");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_910);
              poVar7 = std::operator<<(poVar7," in .mtl.)");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            }
            local_77e = 1;
          }
          else if ((*local_958 == 'P') &&
                  ((local_958[1] == 'r' && ((local_958[2] == ' ' || (local_958[2] == '\t')))))) {
            local_958 = local_958 + 2;
            local_300 = parseReal((char **)in_stack_fffffffffffff260,
                                  (double)in_stack_fffffffffffff258._M_node);
          }
          else if ((*local_958 == 'P') &&
                  ((local_958[1] == 'm' && ((local_958[2] == ' ' || (local_958[2] == '\t')))))) {
            local_958 = local_958 + 2;
            local_2fc = parseReal((char **)in_stack_fffffffffffff260,
                                  (double)in_stack_fffffffffffff258._M_node);
          }
          else if ((*local_958 == 'P') &&
                  ((local_958[1] == 's' && ((local_958[2] == ' ' || (local_958[2] == '\t')))))) {
            local_958 = local_958 + 2;
            local_2f8 = parseReal((char **)in_stack_fffffffffffff260,
                                  (double)in_stack_fffffffffffff258._M_node);
          }
          else if ((*local_958 == 'P') &&
                  ((local_958[1] == 'c' && ((local_958[2] == ' ' || (local_958[2] == '\t')))))) {
            local_958 = local_958 + 2;
            local_2f4 = parseReal((char **)in_stack_fffffffffffff260,
                                  (double)in_stack_fffffffffffff258._M_node);
          }
          else {
            iVar2 = strncmp(local_958,"Pcr",3);
            if ((iVar2 == 0) && ((local_958[3] == ' ' || (local_958[3] == '\t')))) {
              local_958 = local_958 + 4;
              local_2f0 = parseReal((char **)in_stack_fffffffffffff260,
                                    (double)in_stack_fffffffffffff258._M_node);
            }
            else {
              iVar2 = strncmp(local_958,"aniso",5);
              if ((iVar2 == 0) && ((local_958[5] == ' ' || (local_958[5] == '\t')))) {
                local_958 = local_958 + 6;
                in_stack_fffffffffffff294 =
                     parseReal((char **)in_stack_fffffffffffff260,
                               (double)in_stack_fffffffffffff258._M_node);
                local_2ec = in_stack_fffffffffffff294;
              }
              else {
                iVar2 = strncmp(local_958,"anisor",6);
                if ((iVar2 == 0) && ((local_958[6] == ' ' || (local_958[6] == '\t')))) {
                  local_958 = local_958 + 7;
                  in_stack_fffffffffffff290 =
                       parseReal((char **)in_stack_fffffffffffff260,
                                 (double)in_stack_fffffffffffff258._M_node);
                  local_2e8 = in_stack_fffffffffffff290;
                }
                else {
                  iVar2 = strncmp(local_958,"map_Ka",6);
                  if ((iVar2 == 0) && ((local_958[6] == ' ' || (local_958[6] == '\t')))) {
                    local_958 = local_958 + 7;
                    ParseTextureNameAndOption
                              ((string *)
                               CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308),
                               (texture_option_t *)
                               CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                               (char *)in_stack_fffffffffffff2f8);
                  }
                  else {
                    iVar2 = strncmp(local_958,"map_Kd",6);
                    if ((iVar2 == 0) && ((local_958[6] == ' ' || (local_958[6] == '\t')))) {
                      local_958 = local_958 + 7;
                      ParseTextureNameAndOption
                                ((string *)
                                 CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308),
                                 (texture_option_t *)
                                 CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                                 (char *)in_stack_fffffffffffff2f8);
                      if ((local_77f & 1) == 0) {
                        local_744 = 0x3f19999a;
                        local_740 = 0x3f19999a;
                        local_73c = 0x3f19999a;
                      }
                    }
                    else {
                      iVar2 = strncmp(local_958,"map_Ks",6);
                      if ((iVar2 == 0) && ((local_958[6] == ' ' || (local_958[6] == '\t')))) {
                        local_958 = local_958 + 7;
                        ParseTextureNameAndOption
                                  ((string *)
                                   CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308),
                                   (texture_option_t *)
                                   CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                                   (char *)in_stack_fffffffffffff2f8);
                      }
                      else {
                        iVar2 = strncmp(local_958,"map_Ns",6);
                        if ((iVar2 == 0) && ((local_958[6] == ' ' || (local_958[6] == '\t')))) {
                          local_958 = local_958 + 7;
                          ParseTextureNameAndOption
                                    ((string *)
                                     CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308),
                                     (texture_option_t *)
                                     CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300),
                                     (char *)in_stack_fffffffffffff2f8);
                        }
                        else {
                          iVar2 = strncmp(local_958,"map_bump",8);
                          if ((iVar2 == 0) && ((local_958[8] == ' ' || (local_958[8] == '\t')))) {
                            local_958 = local_958 + 9;
                            ParseTextureNameAndOption
                                      ((string *)
                                       CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308)
                                       ,(texture_option_t *)
                                        CONCAT44(in_stack_fffffffffffff304,in_stack_fffffffffffff300
                                                ),(char *)in_stack_fffffffffffff2f8);
                          }
                          else {
                            iVar2 = strncmp(local_958,"map_Bump",8);
                            if ((iVar2 == 0) && ((local_958[8] == ' ' || (local_958[8] == '\t')))) {
                              local_958 = local_958 + 9;
                              ParseTextureNameAndOption
                                        ((string *)
                                         CONCAT44(in_stack_fffffffffffff30c,
                                                  in_stack_fffffffffffff308),
                                         (texture_option_t *)
                                         CONCAT44(in_stack_fffffffffffff304,
                                                  in_stack_fffffffffffff300),
                                         (char *)in_stack_fffffffffffff2f8);
                            }
                            else {
                              iVar2 = strncmp(local_958,"bump",4);
                              if ((iVar2 == 0) && ((local_958[4] == ' ' || (local_958[4] == '\t'))))
                              {
                                local_958 = local_958 + 5;
                                ParseTextureNameAndOption
                                          ((string *)
                                           CONCAT44(in_stack_fffffffffffff30c,
                                                    in_stack_fffffffffffff308),
                                           (texture_option_t *)
                                           CONCAT44(in_stack_fffffffffffff304,
                                                    in_stack_fffffffffffff300),
                                           (char *)in_stack_fffffffffffff2f8);
                              }
                              else {
                                iVar2 = strncmp(local_958,"map_d",5);
                                if ((iVar2 == 0) &&
                                   ((local_958[5] == ' ' || (local_958[5] == '\t')))) {
                                  local_958 = local_958 + 6;
                                  std::__cxx11::string::operator=(local_640,local_958);
                                  ParseTextureNameAndOption
                                            ((string *)
                                             CONCAT44(in_stack_fffffffffffff30c,
                                                      in_stack_fffffffffffff308),
                                             (texture_option_t *)
                                             CONCAT44(in_stack_fffffffffffff304,
                                                      in_stack_fffffffffffff300),
                                             (char *)in_stack_fffffffffffff2f8);
                                }
                                else {
                                  iVar2 = strncmp(local_958,"disp",4);
                                  if ((iVar2 == 0) &&
                                     ((local_958[4] == ' ' || (local_958[4] == '\t')))) {
                                    local_958 = local_958 + 5;
                                    ParseTextureNameAndOption
                                              ((string *)
                                               CONCAT44(in_stack_fffffffffffff30c,
                                                        in_stack_fffffffffffff308),
                                               (texture_option_t *)
                                               CONCAT44(in_stack_fffffffffffff304,
                                                        in_stack_fffffffffffff300),
                                               (char *)in_stack_fffffffffffff2f8);
                                  }
                                  else {
                                    iVar2 = strncmp(local_958,"refl",4);
                                    if ((iVar2 == 0) &&
                                       ((local_958[4] == ' ' || (local_958[4] == '\t')))) {
                                      local_958 = local_958 + 5;
                                      ParseTextureNameAndOption
                                                ((string *)
                                                 CONCAT44(in_stack_fffffffffffff30c,
                                                          in_stack_fffffffffffff308),
                                                 (texture_option_t *)
                                                 CONCAT44(in_stack_fffffffffffff304,
                                                          in_stack_fffffffffffff300),
                                                 (char *)in_stack_fffffffffffff2f8);
                                    }
                                    else {
                                      iVar2 = strncmp(local_958,"map_Pr",6);
                                      if ((iVar2 == 0) &&
                                         ((local_958[6] == ' ' || (local_958[6] == '\t')))) {
                                        local_958 = local_958 + 7;
                                        ParseTextureNameAndOption
                                                  ((string *)
                                                   CONCAT44(in_stack_fffffffffffff30c,
                                                            in_stack_fffffffffffff308),
                                                   (texture_option_t *)
                                                   CONCAT44(in_stack_fffffffffffff304,
                                                            in_stack_fffffffffffff300),
                                                   (char *)in_stack_fffffffffffff2f8);
                                      }
                                      else {
                                        iVar2 = strncmp(local_958,"map_Pm",6);
                                        if ((iVar2 == 0) &&
                                           ((local_958[6] == ' ' || (local_958[6] == '\t')))) {
                                          local_958 = local_958 + 7;
                                          ParseTextureNameAndOption
                                                    ((string *)
                                                     CONCAT44(in_stack_fffffffffffff30c,
                                                              in_stack_fffffffffffff308),
                                                     (texture_option_t *)
                                                     CONCAT44(in_stack_fffffffffffff304,
                                                              in_stack_fffffffffffff300),
                                                     (char *)in_stack_fffffffffffff2f8);
                                        }
                                        else {
                                          iVar2 = strncmp(local_958,"map_Ps",6);
                                          if ((iVar2 == 0) &&
                                             ((local_958[6] == ' ' || (local_958[6] == '\t')))) {
                                            local_958 = local_958 + 7;
                                            ParseTextureNameAndOption
                                                      ((string *)
                                                       CONCAT44(in_stack_fffffffffffff30c,
                                                                in_stack_fffffffffffff308),
                                                       (texture_option_t *)
                                                       CONCAT44(in_stack_fffffffffffff304,
                                                                in_stack_fffffffffffff300),
                                                       (char *)in_stack_fffffffffffff2f8);
                                          }
                                          else {
                                            iVar2 = strncmp(local_958,"map_Ke",6);
                                            if ((iVar2 == 0) &&
                                               ((local_958[6] == ' ' || (local_958[6] == '\t')))) {
                                              local_958 = local_958 + 7;
                                              ParseTextureNameAndOption
                                                        ((string *)
                                                         CONCAT44(in_stack_fffffffffffff30c,
                                                                  in_stack_fffffffffffff308),
                                                         (texture_option_t *)
                                                         CONCAT44(in_stack_fffffffffffff304,
                                                                  in_stack_fffffffffffff300),
                                                         (char *)in_stack_fffffffffffff2f8);
                                            }
                                            else {
                                              iVar2 = strncmp(local_958,"norm",4);
                                              if ((iVar2 == 0) &&
                                                 ((local_958[4] == ' ' || (local_958[4] == '\t'))))
                                              {
                                                local_958 = local_958 + 5;
                                                ParseTextureNameAndOption
                                                          ((string *)
                                                           CONCAT44(in_stack_fffffffffffff30c,
                                                                    in_stack_fffffffffffff308),
                                                           (texture_option_t *)
                                                           CONCAT44(in_stack_fffffffffffff304,
                                                                    in_stack_fffffffffffff300),
                                                           (char *)in_stack_fffffffffffff2f8);
                                              }
                                              else {
                                                local_b88 = strchr(local_958,0x20);
                                                if (local_b88 == (char *)0x0) {
                                                  local_b88 = strchr(local_958,9);
                                                }
                                                pcVar4 = local_958;
                                                if (local_b88 != (char *)0x0) {
                                                  uVar8 = (long)local_b88 - (long)local_958;
                                                  in_stack_fffffffffffff288 =
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_bb1;
                                                  local_b90 = uVar8;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            ((string *)(local_bb1 + 1),pcVar4,uVar8,
                                                             (allocator *)in_stack_fffffffffffff288)
                                                  ;
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)local_bb1);
                                                  pcVar4 = local_b88 + 1;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string
                                                            (local_bd8,pcVar4,&local_bd9);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)&local_bd9);
                                                  in_stack_fffffffffffff260 = &local_58;
                                                  std::
                                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::
                                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                                            (in_stack_fffffffffffff260,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)in_stack_fffffffffffff258._M_node,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffff257,
                                                             in_stack_fffffffffffff250));
                                                  _Var10 = std::
                                                  map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                                  ::
                                                  insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                                            ((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)CONCAT17(in_stack_fffffffffffff257,
                                                             in_stack_fffffffffffff250),
                                                  (
                                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_fffffffffffff248);
                                                  in_stack_fffffffffffff258 = _Var10.first._M_node;
                                                  in_stack_fffffffffffff257 = _Var10.second;
                                                  local_c30 = in_stack_fffffffffffff258._M_node;
                                                  local_c28 = in_stack_fffffffffffff257;
                                                  std::
                                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~pair((
                                                  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)in_stack_fffffffffffff240);
                                                  std::__cxx11::string::~string(local_bd8);
                                                  std::__cxx11::string::~string
                                                            ((string *)(local_bb1 + 1));
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  sVar6 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::size(local_10);
  local_c5c = (undefined4)sVar6;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),&local_8->name,
             (int *)in_stack_fffffffffffff240);
  _Var9 = std::
          map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::insert<std::pair<std::__cxx11::string,int>>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *)CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)local_8);
  this = _Var9.first._M_node;
  local_c68 = _Var9.second;
  local_c70 = this._M_node;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)0x1a9561);
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
            ((vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *)
             CONCAT17(in_stack_fffffffffffff257,in_stack_fffffffffffff250),local_8);
  if (local_58.second.field_2._8_8_ != 0) {
    std::__cxx11::stringstream::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
               in_stack_fffffffffffff288);
    std::__cxx11::string::~string(local_c90);
  }
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::stringstream::~stringstream(local_908);
  material_t::~material_t((material_t *)this._M_node);
  return;
}

Assistant:

void LoadMtl(std::map<std::string, int> *material_map,
             std::vector<material_t> *materials, std::istream *inStream,
             std::string *warning, std::string *err) {
  (void)err;

  // Create a default material anyway.
  material_t material;
  InitMaterial(&material);

  // Issue 43. `d` wins against `Tr` since `Tr` is not in the MTL specification.
  bool has_d = false;
  bool has_tr = false;

  // has_kd is used to set a default diffuse value when map_Kd is present
  // and Kd is not.
  bool has_kd = false;

  std::stringstream warn_ss;

  size_t line_no = 0;
  std::string linebuf;
  while (inStream->peek() != -1) {
    safeGetline(*inStream, linebuf);
    line_no++;

    // Trim trailing whitespace.
    if (linebuf.size() > 0) {
      linebuf = linebuf.substr(0, linebuf.find_last_not_of(" \t") + 1);
    }

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // new mtl
    if ((0 == strncmp(token, "newmtl", 6)) && IS_SPACE((token[6]))) {
      // flush previous material.
      if (!material.name.empty()) {
        material_map->insert(std::pair<std::string, int>(
            material.name, static_cast<int>(materials->size())));
        materials->push_back(material);
      }

      // initial temporary material
      InitMaterial(&material);

      has_d = false;
      has_tr = false;

      // set new mtl name
      token += 7;
      {
        std::stringstream sstr;
        sstr << token;
        material.name = sstr.str();
      }
      continue;
    }

    // ambient
    if (token[0] == 'K' && token[1] == 'a' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.ambient[0] = r;
      material.ambient[1] = g;
      material.ambient[2] = b;
      continue;
    }

    // diffuse
    if (token[0] == 'K' && token[1] == 'd' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.diffuse[0] = r;
      material.diffuse[1] = g;
      material.diffuse[2] = b;
      has_kd = true;
      continue;
    }

    // specular
    if (token[0] == 'K' && token[1] == 's' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.specular[0] = r;
      material.specular[1] = g;
      material.specular[2] = b;
      continue;
    }

    // transmittance
    if ((token[0] == 'K' && token[1] == 't' && IS_SPACE((token[2]))) ||
        (token[0] == 'T' && token[1] == 'f' && IS_SPACE((token[2])))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.transmittance[0] = r;
      material.transmittance[1] = g;
      material.transmittance[2] = b;
      continue;
    }

    // ior(index of refraction)
    if (token[0] == 'N' && token[1] == 'i' && IS_SPACE((token[2]))) {
      token += 2;
      material.ior = parseReal(&token);
      continue;
    }

    // emission
    if (token[0] == 'K' && token[1] == 'e' && IS_SPACE(token[2])) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.emission[0] = r;
      material.emission[1] = g;
      material.emission[2] = b;
      continue;
    }

    // shininess
    if (token[0] == 'N' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.shininess = parseReal(&token);
      continue;
    }

    // illum model
    if (0 == strncmp(token, "illum", 5) && IS_SPACE(token[5])) {
      token += 6;
      material.illum = parseInt(&token);
      continue;
    }

    // dissolve
    if ((token[0] == 'd' && IS_SPACE(token[1]))) {
      token += 1;
      material.dissolve = parseReal(&token);

      if (has_tr) {
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      }
      has_d = true;
      continue;
    }
    if (token[0] == 'T' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      if (has_d) {
        // `d` wins. Ignore `Tr` value.
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      } else {
        // We invert value of Tr(assume Tr is in range [0, 1])
        // NOTE: Interpretation of Tr is application(exporter) dependent. For
        // some application(e.g. 3ds max obj exporter), Tr = d(Issue 43)
        material.dissolve = static_cast<real_t>(1.0) - parseReal(&token);
      }
      has_tr = true;
      continue;
    }

    // PBR: roughness
    if (token[0] == 'P' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      material.roughness = parseReal(&token);
      continue;
    }

    // PBR: metallic
    if (token[0] == 'P' && token[1] == 'm' && IS_SPACE(token[2])) {
      token += 2;
      material.metallic = parseReal(&token);
      continue;
    }

    // PBR: sheen
    if (token[0] == 'P' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.sheen = parseReal(&token);
      continue;
    }

    // PBR: clearcoat thickness
    if (token[0] == 'P' && token[1] == 'c' && IS_SPACE(token[2])) {
      token += 2;
      material.clearcoat_thickness = parseReal(&token);
      continue;
    }

    // PBR: clearcoat roughness
    if ((0 == strncmp(token, "Pcr", 3)) && IS_SPACE(token[3])) {
      token += 4;
      material.clearcoat_roughness = parseReal(&token);
      continue;
    }

    // PBR: anisotropy
    if ((0 == strncmp(token, "aniso", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.anisotropy = parseReal(&token);
      continue;
    }

    // PBR: anisotropy rotation
    if ((0 == strncmp(token, "anisor", 6)) && IS_SPACE(token[6])) {
      token += 7;
      material.anisotropy_rotation = parseReal(&token);
      continue;
    }

    // ambient texture
    if ((0 == strncmp(token, "map_Ka", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.ambient_texname),
                                &(material.ambient_texopt), token);
      continue;
    }

    // diffuse texture
    if ((0 == strncmp(token, "map_Kd", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.diffuse_texname),
                                &(material.diffuse_texopt), token);

      // Set a decent diffuse default value if a diffuse texture is specified
      // without a matching Kd value.
      if (!has_kd) {
        material.diffuse[0] = static_cast<real_t>(0.6);
        material.diffuse[1] = static_cast<real_t>(0.6);
        material.diffuse[2] = static_cast<real_t>(0.6);
      }

      continue;
    }

    // specular texture
    if ((0 == strncmp(token, "map_Ks", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_texname),
                                &(material.specular_texopt), token);
      continue;
    }

    // specular highlight texture
    if ((0 == strncmp(token, "map_Ns", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_highlight_texname),
                                &(material.specular_highlight_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_Bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "bump", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // alpha texture
    if ((0 == strncmp(token, "map_d", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.alpha_texname = token;
      ParseTextureNameAndOption(&(material.alpha_texname),
                                &(material.alpha_texopt), token);
      continue;
    }

    // displacement texture
    if ((0 == strncmp(token, "disp", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.displacement_texname),
                                &(material.displacement_texopt), token);
      continue;
    }

    // reflection map
    if ((0 == strncmp(token, "refl", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.reflection_texname),
                                &(material.reflection_texopt), token);
      continue;
    }

    // PBR: roughness texture
    if ((0 == strncmp(token, "map_Pr", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.roughness_texname),
                                &(material.roughness_texopt), token);
      continue;
    }

    // PBR: metallic texture
    if ((0 == strncmp(token, "map_Pm", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.metallic_texname),
                                &(material.metallic_texopt), token);
      continue;
    }

    // PBR: sheen texture
    if ((0 == strncmp(token, "map_Ps", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.sheen_texname),
                                &(material.sheen_texopt), token);
      continue;
    }

    // PBR: emissive texture
    if ((0 == strncmp(token, "map_Ke", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.emissive_texname),
                                &(material.emissive_texopt), token);
      continue;
    }

    // PBR: normal map texture
    if ((0 == strncmp(token, "norm", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.normal_texname),
                                &(material.normal_texopt), token);
      continue;
    }

    // unknown parameter
    const char *_space = strchr(token, ' ');
    if (!_space) {
      _space = strchr(token, '\t');
    }
    if (_space) {
      std::ptrdiff_t len = _space - token;
      std::string key(token, static_cast<size_t>(len));
      std::string value = _space + 1;
      material.unknown_parameter.insert(
          std::pair<std::string, std::string>(key, value));
    }
  }
  // flush last material.
  material_map->insert(std::pair<std::string, int>(
      material.name, static_cast<int>(materials->size())));
  materials->push_back(material);

  if (warning) {
    (*warning) = warn_ss.str();
  }
}